

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void norm_3d(float32 ***arr,uint32 d1,uint32 d2,uint32 d3)

{
  float32 *pfVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (d1 != 0) {
    uVar4 = 0;
    do {
      if (d2 != 0) {
        uVar5 = 0;
        do {
          if (d3 != 0) {
            fVar2 = 0.0;
            uVar3 = 0;
            do {
              fVar2 = fVar2 + (float)arr[uVar4][uVar5][uVar3];
              uVar3 = uVar3 + 1;
            } while (d3 != uVar3);
            if (d3 != 0) {
              pfVar1 = arr[uVar4][uVar5];
              uVar3 = 0;
              do {
                pfVar1[uVar3] = (float32)((float)pfVar1[uVar3] * (1.0 / fVar2));
                uVar3 = uVar3 + 1;
              } while (d3 != uVar3);
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != d2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != d1);
  }
  return;
}

Assistant:

void
norm_3d(float32 ***arr,
	uint32 d1,
	uint32 d2,
	uint32 d3)
{
    uint32 i, j, k;
    float64 s;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {

	    /* compute sum (i, j) as over all k */
	    for (k = 0, s = 0; k < d3; k++) {
		s += arr[i][j][k];
	    }

	    /* do 1 floating point divide */
	    s = 1.0 / s;

	    /* divide all k by sum over k */
	    for (k = 0; k < d3; k++) {
		arr[i][j][k] *= s;
	    }
	}
    }
}